

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

uint __thiscall EthUdpPort::GetPrefixOffset(EthUdpPort *this,MsgType msg)

{
  uint uVar1;
  ostream *poVar2;
  
  if (msg < (RD_FW_BDATA|WR_FW_HEADER)) {
    uVar1 = *(uint *)(&DAT_00119c8c + (ulong)msg * 4);
  }
  else {
    poVar2 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                             "EthUdpPort::GetPrefixOffset: Invalid type: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,msg);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned int EthUdpPort::GetPrefixOffset(MsgType msg) const
{
    switch (msg) {
        case WR_CTRL:      return 0;
        case WR_FW_HEADER: return FW_CTRL_SIZE;
        case WR_FW_BDATA:  return FW_CTRL_SIZE+FW_BWRITE_HEADER_SIZE;
        case RD_FW_HEADER: return 0;
        case RD_FW_BDATA:  return FW_BRESPONSE_HEADER_SIZE;
    }
    outStr << "EthUdpPort::GetPrefixOffset: Invalid type: " << msg << std::endl;
    return 0;
}